

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGNumberPercentage::parse(SVGNumberPercentage *this,string_view input)

{
  bool bVar1;
  const_reference pvVar2;
  float *pfVar3;
  float local_34;
  float local_30;
  float local_2c;
  SVGNumberPercentage *pSStack_28;
  float value;
  SVGNumberPercentage *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGNumberPercentage *)input._M_len;
  local_2c = 0.0;
  pSStack_28 = this;
  stripLeadingAndTrailingSpaces((string_view *)&this_local);
  bVar1 = parseNumber<float>((string_view *)&this_local,&local_2c);
  if (bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      if (*pvVar2 == '%') {
        local_2c = local_2c / 100.0;
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
      }
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar1) {
      local_30 = 0.0;
      local_34 = 1.0;
      pfVar3 = std::clamp<float>(&local_2c,&local_30,&local_34);
      *(float *)&(this->super_SVGProperty).field_0xc = *pfVar3;
      input_local._M_str._7_1_ = true;
    }
    else {
      input_local._M_str._7_1_ = false;
    }
  }
  else {
    input_local._M_str._7_1_ = false;
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool SVGNumberPercentage::parse(std::string_view input)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(!input.empty() && input.front() == '%') {
        value /= 100.f;
        input.remove_prefix(1);
    }

    if(!input.empty())
        return false;
    m_value = std::clamp(value, 0.f, 1.f);
    return true;
}